

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathFunction xmlXPathFunctionLookupNS(xmlXPathContextPtr ctxt,xmlChar *name,xmlChar *ns_uri)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  xmlXPathFuncLookupFunc f;
  int funcIndex;
  int bucketIndex;
  void *payload;
  xmlXPathFunction ret;
  xmlChar *ns_uri_local;
  xmlChar *name_local;
  xmlXPathContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathContextPtr)0x0) {
    ctxt_local = (xmlXPathContextPtr)0x0;
  }
  else if (name == (xmlChar *)0x0) {
    ctxt_local = (xmlXPathContextPtr)0x0;
  }
  else {
    if (ns_uri == (xmlChar *)0x0) {
      uVar2 = xmlXPathSFComputeHash(name);
      f._4_4_ = uVar2 & 0x3f;
      while (xmlXPathSFHash[(int)f._4_4_] != 0xff) {
        bVar1 = xmlXPathSFHash[(int)f._4_4_];
        iVar3 = strcmp(xmlXPathStandardFunctions[(int)(uint)bVar1].name,(char *)name);
        if (iVar3 == 0) {
          return xmlXPathStandardFunctions[(int)(uint)bVar1].func;
        }
        f._4_4_ = f._4_4_ + 1;
        if (0x3f < (int)f._4_4_) {
          f._4_4_ = 0;
        }
      }
    }
    if ((ctxt->funcLookupFunc == (xmlXPathFuncLookupFunc)0x0) ||
       (ctxt_local = (xmlXPathContextPtr)(*ctxt->funcLookupFunc)(ctxt->funcLookupData,name,ns_uri),
       ctxt_local == (xmlXPathContextPtr)0x0)) {
      if (ctxt->funcHash == (xmlHashTablePtr)0x0) {
        ctxt_local = (xmlXPathContextPtr)0x0;
      }
      else {
        ctxt_local = (xmlXPathContextPtr)xmlHashLookup2(ctxt->funcHash,name,ns_uri);
      }
    }
  }
  return (xmlXPathFunction)ctxt_local;
}

Assistant:

xmlXPathFunction
xmlXPathFunctionLookupNS(xmlXPathContextPtr ctxt, const xmlChar *name,
			 const xmlChar *ns_uri) {
    xmlXPathFunction ret;
    void *payload;

    if (ctxt == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);

    if (ns_uri == NULL) {
        int bucketIndex = xmlXPathSFComputeHash(name) % SF_HASH_SIZE;

        while (xmlXPathSFHash[bucketIndex] != UCHAR_MAX) {
            int funcIndex = xmlXPathSFHash[bucketIndex];

            if (strcmp(xmlXPathStandardFunctions[funcIndex].name,
                       (char *) name) == 0)
                return(xmlXPathStandardFunctions[funcIndex].func);

            bucketIndex += 1;
            if (bucketIndex >= SF_HASH_SIZE)
                bucketIndex = 0;
        }
    }

    if (ctxt->funcLookupFunc != NULL) {
	xmlXPathFuncLookupFunc f;

	f = ctxt->funcLookupFunc;
	ret = f(ctxt->funcLookupData, name, ns_uri);
	if (ret != NULL)
	    return(ret);
    }

    if (ctxt->funcHash == NULL)
	return(NULL);

    payload = xmlHashLookup2(ctxt->funcHash, name, ns_uri);
    memcpy(&ret, &payload, sizeof(payload));

    return(ret);
}